

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall
ByteCodeGenerator::FinalizeRegisters
          (ByteCodeGenerator *this,FuncInfo *funcInfo,FunctionBody *byteCodeFunction)

{
  uint32 val;
  code *pcVar1;
  bool bVar2;
  RegSlot reg;
  undefined4 *puVar3;
  FunctionInfo *pFVar4;
  FunctionBody *this_00;
  int iVar5;
  
  if ((*(uint *)&funcInfo->field_0xb4 >> 0xe & 1) != 0) {
    if ((*(uint *)&funcInfo->field_0xb4 & 0x20) == 0) {
      bVar2 = FuncInfo::IsGlobalFunction(funcInfo);
      if (!bVar2) goto LAB_00800cdb;
      bVar2 = (this->flags & 0x400) == 0;
    }
    else {
LAB_00800cdb:
      bVar2 = false;
    }
    FuncInfo::AssignEnvRegister(funcInfo,bVar2);
  }
  this_00 = byteCodeFunction;
  Js::FunctionBody::CheckAndSetConstantCount(byteCodeFunction,funcInfo->constRegsCount);
  SetClosureRegisters((ByteCodeGenerator *)this_00,funcInfo,byteCodeFunction);
  bVar2 = IsInDebugMode(this);
  if (bVar2) {
LAB_00800ddb:
    val = funcInfo->innerScopeCount;
    Js::FunctionBody::SetCountField(byteCodeFunction,InnerScopeCount,val);
    if (val != 0) {
      reg = FuncInfo::NextVarRegister(funcInfo);
      FuncInfo::SetFirstInnerScopeReg(funcInfo,reg);
      if (val != 1) {
        iVar5 = val - 1;
        do {
          FuncInfo::NextVarRegister(funcInfo);
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
    }
  }
  else {
    pFVar4 = (byteCodeFunction->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    if (pFVar4 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar2) goto LAB_00800f2a;
      *puVar3 = 0;
      pFVar4 = (byteCodeFunction->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if ((FunctionBody *)(pFVar4->functionBodyImpl).ptr != byteCodeFunction) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                         ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                         "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar2) goto LAB_00800f2a;
      *puVar3 = 0;
      pFVar4 = (byteCodeFunction->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    if ((pFVar4->attributes & (Async|Generator)) != None) goto LAB_00800ddb;
  }
  pFVar4 = (byteCodeFunction->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar4 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_00800f2a;
    *puVar3 = 0;
    pFVar4 = (byteCodeFunction->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((FunctionBody *)(pFVar4->functionBodyImpl).ptr != byteCodeFunction) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                       "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) {
LAB_00800f2a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    pFVar4 = (byteCodeFunction->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((pFVar4->attributes & (Async|Generator)) != None) {
    if ((funcInfo->root->fncFlags & kFunctionIsAsync) != kFunctionNone) {
      FuncInfo::AssignAwaitRegister(funcInfo);
    }
    FuncInfo::AssignYieldRegister(funcInfo);
  }
  FuncInfo::SetFirstTmpReg(funcInfo,funcInfo->varRegsCount);
  Js::FunctionBody::SetFirstTmpReg
            (byteCodeFunction,funcInfo->varRegsCount + funcInfo->constRegsCount);
  return;
}

Assistant:

void ByteCodeGenerator::FinalizeRegisters(FuncInfo* funcInfo, Js::FunctionBody* byteCodeFunction)
{
    if (funcInfo->NeedEnvRegister())
    {
        bool constReg = !funcInfo->GetIsTopLevelEventHandler() && funcInfo->IsGlobalFunction() && !(this->flags & fscrEval);
        funcInfo->AssignEnvRegister(constReg);
    }

    // Set the function body's constant count before emitting anything so that the byte code writer
    // can distinguish constants from variables.
    byteCodeFunction->CheckAndSetConstantCount(funcInfo->constRegsCount);

    this->SetClosureRegisters(funcInfo, byteCodeFunction);

    if (this->IsInDebugMode() || byteCodeFunction->IsCoroutine())
    {
        // Give permanent registers to the inner scopes in debug mode.
        // TODO: We create seperate debuggerscopes for each block which has own scope. These are stored in the var registers
        // allocated below. Ideally we should change this logic to not allocate separate registers for these and save the debug
        // info in corresponding symbols and use it from there. This will also affect the temp register allocation logic in
        // EmitOneFunction.
        uint innerScopeCount = funcInfo->InnerScopeCount();
        byteCodeFunction->SetInnerScopeCount(innerScopeCount);
        if (innerScopeCount)
        {
            funcInfo->SetFirstInnerScopeReg(funcInfo->NextVarRegister());
            for (uint i = 1; i < innerScopeCount; i++)
            {
                funcInfo->NextVarRegister();
            }
        }
    }

    // NOTE: The FunctionBody expects the yield reg to be the final non-temp.
    if (byteCodeFunction->IsCoroutine())
    {
        if (funcInfo->root->IsAsync())
        {
            funcInfo->AssignAwaitRegister();
        }
        funcInfo->AssignYieldRegister();
    }

    Js::RegSlot firstTmpReg = funcInfo->varRegsCount;
    funcInfo->SetFirstTmpReg(firstTmpReg);
    byteCodeFunction->SetFirstTmpReg(funcInfo->RegCount());
}